

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::ir_declare_param
          (irGenerator *this,string *name,SymbolKind kind,int id)

{
  pointer pcVar1;
  PtrTy *this_00;
  iterator iVar2;
  value_type local_98;
  PtrTy *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  SharedTyPtr local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  string local_48;
  
  local_98.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ir_declare_value(this,&local_48,kind,id,&local_68,Var,0);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (kind == INT) {
    local_88 = (PtrTy *)operator_new(8);
    (local_88->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecd58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              (&_Stack_80,(IntTy *)local_88);
    local_98.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_Ty;
    local_98.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_80._M_pi;
  }
  else if (kind == Ptr) {
    this_00 = (PtrTy *)operator_new(0x18);
    local_78.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(8);
    ((Displayable *)
    &((local_78.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_Displayable)._vptr_Displayable)->_vptr_Displayable = (_func_int **)&PTR_display_001ecd58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              (&local_78.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (IntTy *)local_78.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    mir::types::PtrTy::PtrTy(this_00,&local_78);
    local_88 = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
              (&_Stack_80,this_00);
    local_98.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_80._M_pi;
    local_98.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_Ty;
    local_88 = (PtrTy *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_78.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          ::find(&(this->_package).functions._M_t,
                 (this->_funcStack).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  push_back((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
             *)&(iVar2._M_node[3]._M_parent)->_M_right,&local_98);
  if (local_98.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void irGenerator::ir_declare_param(string name, symbol::SymbolKind kind,
                                   int id) {
  SharedTyPtr ty;

  ir_declare_value(name, kind, id, {});

  switch (kind) {
    case front::symbol::SymbolKind::INT: {
      ty = SharedTyPtr(new IntTy());
      break;
    }
    case front::symbol::SymbolKind::Ptr: {
      ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
      break;
    }
    default:
      break;
  }
  _package.functions.find(_funcStack.back())->second.type->params.push_back(ty);
}